

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHash.h
# Opt level: O3

Hash_IntMan_t * Hash_IntManStart(int nSize)

{
  uint uVar1;
  Hash_IntMan_t *pHVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  pHVar2 = (Hash_IntMan_t *)calloc(1,0x18);
  uVar7 = nSize + 99;
  while( true ) {
    do {
      uVar6 = uVar7;
      uVar7 = uVar6 + 1;
    } while ((uVar6 & 1) != 0);
    if (uVar7 < 9) break;
    iVar5 = 5;
    while( true ) {
      if (uVar7 % (iVar5 - 2U) == 0) break;
      uVar1 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar7 < uVar1) goto LAB_006855f6;
    }
  }
LAB_006855f6:
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  uVar1 = uVar7;
  if (uVar6 < 0xf) {
    uVar1 = 0x10;
  }
  pVVar3->nCap = uVar1;
  piVar4 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar3->pArray = piVar4;
  pVVar3->nSize = uVar7;
  memset(piVar4,0,(long)(int)uVar7 << 2);
  pHVar2->vTable = pVVar3;
  iVar5 = nSize * 4 + 400;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  if (nSize * 4 + 399U < 0xf) {
    iVar5 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    pVVar3->pArray = (int *)0x0;
    pHVar2->vObjs = pVVar3;
LAB_006856b5:
    piVar4 = (int *)malloc(0x10);
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
    pVVar3->pArray = piVar4;
    pHVar2->vObjs = pVVar3;
    if (3 < iVar5) goto LAB_006856ce;
    if (piVar4 == (int *)0x0) goto LAB_006856b5;
    piVar4 = (int *)realloc(piVar4,0x10);
  }
  pVVar3->pArray = piVar4;
  if (piVar4 == (int *)0x0) {
    __assert_fail("p->pArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
  }
  pVVar3->nCap = 4;
LAB_006856ce:
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  pVVar3->nSize = 4;
  pHVar2->nRefs = 1;
  return pHVar2;
}

Assistant:

static inline Hash_IntMan_t * Hash_IntManStart( int nSize )
{
    Hash_IntMan_t * p;  nSize += 100;
    p = ABC_CALLOC( Hash_IntMan_t, 1 );
    p->vTable = Vec_IntStart( Abc_PrimeCudd(nSize) );
    p->vObjs  = Vec_IntAlloc( 4*nSize );
    Vec_IntFill( p->vObjs, 4, 0 );
    p->nRefs  = 1;
    return p;
}